

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O2

Iterator * leveldb::Table::BlockReader(void *arg,ReadOptions *options,Slice *index_value)

{
  Block *pBVar1;
  Status SVar2;
  Iterator *this;
  void *arg2;
  Block *this_00;
  code *func;
  Status s;
  BlockHandle handle;
  BlockContents contents;
  char cache_key_buffer [16];
  char *local_50;
  Slice key;
  Slice input;
  
  pBVar1 = *(Block **)(*arg + 0x30);
  handle.offset_._0_4_ = 0xffffffff;
  handle.offset_._4_4_ = 0xffffffff;
  handle.size_._0_4_ = 0xffffffff;
  handle.size_._4_4_ = 0xffffffff;
  BlockHandle::DecodeFrom((BlockHandle *)&s,(Slice *)&handle);
  if (s.state_ == (char *)0x0) {
    contents.data.data_ = "";
    contents.data.size_ = 0;
    if (pBVar1 == (Block *)0x0) {
      ReadBlock((leveldb *)cache_key_buffer,*(RandomAccessFile **)&(*arg)[1].create_if_missing,*arg,
                options,&handle,&contents);
      SVar2 = s;
      s.state_ = (char *)cache_key_buffer._0_8_;
      cache_key_buffer._0_8_ = SVar2.state_;
      Status::~Status((Status *)cache_key_buffer);
      if (s.state_ == (char *)0x0) {
        this_00 = (Block *)operator_new(0x18);
        Block::Block(this_00,&contents);
LAB_00107d22:
        arg2 = (void *)0x0;
        goto LAB_00107d25;
      }
    }
    else {
      cache_key_buffer._0_8_ = *(undefined8 *)(*arg + 0x870);
      key.data_ = cache_key_buffer;
      cache_key_buffer._12_4_ = handle.offset_._4_4_;
      cache_key_buffer._8_4_ = (undefined4)handle.offset_;
      key.size_ = 0x10;
      arg2 = (void *)(**(code **)(pBVar1->data_ + 0x18))(pBVar1);
      if (arg2 == (void *)0x0) {
        ReadBlock((leveldb *)&local_50,*(RandomAccessFile **)&(*arg)[1].create_if_missing,*arg,
                  options,&handle,&contents);
        SVar2 = s;
        s.state_ = local_50;
        local_50 = SVar2.state_;
        Status::~Status((Status *)&local_50);
        if (s.state_ == (char *)0x0) {
          this_00 = (Block *)operator_new(0x18);
          Block::Block(this_00,&contents);
          if ((contents.cachable != true) || (options->fill_cache != true)) goto LAB_00107d22;
          arg2 = (void *)(**(code **)(pBVar1->data_ + 0x10))
                                   (pBVar1,&key,this_00,this_00->size_,DeleteCachedBlock);
          goto LAB_00107d25;
        }
      }
      else {
        this_00 = (Block *)(**(code **)(pBVar1->data_ + 0x28))(pBVar1,arg2);
        if (this_00 != (Block *)0x0) {
LAB_00107d25:
          this = Block::NewIterator(this_00,(Comparator *)**arg);
          if (arg2 == (void *)0x0) {
            func = DeleteBlock;
            arg2 = (void *)0x0;
          }
          else {
            func = ReleaseBlock;
            this_00 = pBVar1;
          }
          Iterator::RegisterCleanup(this,func,this_00,arg2);
          goto LAB_00107b94;
        }
      }
    }
  }
  this = NewErrorIterator(&s);
LAB_00107b94:
  Status::~Status(&s);
  return this;
}

Assistant:

Iterator* Table::BlockReader(void* arg, const ReadOptions& options,
                             const Slice& index_value) {
  Table* table = reinterpret_cast<Table*>(arg);
  Cache* block_cache = table->rep_->options.block_cache;
  Block* block = nullptr;
  Cache::Handle* cache_handle = nullptr;

  BlockHandle handle;
  Slice input = index_value;
  Status s = handle.DecodeFrom(&input);
  // We intentionally allow extra stuff in index_value so that we
  // can add more features in the future.

  if (s.ok()) {
    BlockContents contents;
    if (block_cache != nullptr) {
      char cache_key_buffer[16];
      EncodeFixed64(cache_key_buffer, table->rep_->cache_id);
      EncodeFixed64(cache_key_buffer + 8, handle.offset());
      Slice key(cache_key_buffer, sizeof(cache_key_buffer));
      cache_handle = block_cache->Lookup(key);
      if (cache_handle != nullptr) {
        block = reinterpret_cast<Block*>(block_cache->Value(cache_handle));
      } else {
        s = ReadBlock(table->rep_->file, table->rep_->options, options, handle, &contents);
        if (s.ok()) {
          block = new Block(contents);
          if (contents.cachable && options.fill_cache) {
            cache_handle = block_cache->Insert(key, block, block->size(),
                                               &DeleteCachedBlock);
          }
        }
      }
    } else {
      s = ReadBlock(table->rep_->file, table->rep_->options, options, handle, &contents);
      if (s.ok()) {
        block = new Block(contents);
      }
    }
  }

  Iterator* iter;
  if (block != nullptr) {
    iter = block->NewIterator(table->rep_->options.comparator);
    if (cache_handle == nullptr) {
      iter->RegisterCleanup(&DeleteBlock, block, nullptr);
    } else {
      iter->RegisterCleanup(&ReleaseBlock, block_cache, cache_handle);
    }
  } else {
    iter = NewErrorIterator(s);
  }
  return iter;
}